

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef::~IfcCircleHollowProfileDef
          (IfcCircleHollowProfileDef *this)

{
  undefined1 *puVar1;
  
  this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef.
  ProfileName.ptr._M_dataplus._M_p = (pointer)0x828688;
  *(undefined8 *)
   &(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x18 = 0x8286b0;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef
             .field_0x60;
  if (puVar1 != &this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = (undefined1 *)
           this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef.
           ProfileName.ptr.field_2._M_allocated_capacity;
  if ((bool *)puVar1 !=
      &this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef.
       ProfileName.have) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcCircleProfileDef.super_IfcParameterizedProfileDef.
                   super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcCircleHollowProfileDef() : Object("IfcCircleHollowProfileDef") {}